

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DPolyAction::StopInterpolation(DPolyAction *this)

{
  bool bVar1;
  DInterpolation *this_00;
  DPolyAction *this_local;
  
  bVar1 = TObjPtr<DInterpolation>::operator!=(&this->m_Interpolation,(DInterpolation *)0x0);
  if (bVar1) {
    this_00 = TObjPtr<DInterpolation>::operator->(&this->m_Interpolation);
    DInterpolation::DelRef(this_00,false);
    TObjPtr<DInterpolation>::operator=(&this->m_Interpolation,(DInterpolation *)0x0);
  }
  return;
}

Assistant:

void DPolyAction::StopInterpolation ()
{
	if (m_Interpolation != NULL)
	{
		m_Interpolation->DelRef();
		m_Interpolation = NULL;
	}
}